

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O1

void __thiscall ser::CentralizedFileFormat::ImportTables(CentralizedFileFormat *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FieldsTable *this_00;
  OffsetTable *this_01;
  int iVar3;
  JSONNode **ppJVar4;
  undefined8 in_R9;
  JSONNode node;
  string json_txt;
  ifstream fs;
  internalJSONNode *local_278;
  json_string local_270;
  json_string local_250;
  long local_230 [29];
  undefined8 auStack_148 [36];
  
  std::ifstream::ifstream(local_230,(this->databaseFile_)._M_dataplus._M_p,_S_in);
  local_250._M_string_length = 0;
  local_250.field_2._M_local_buf[0] = '\0';
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::istream::seekg((long)local_230,_S_beg);
  iVar3 = std::istream::tellg();
  if (iVar3 < 1) {
    std::ifstream::close();
    MetainfoSet::Cleanup((this->super_FileFormat).pGlobalMetainfo_);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
             *)(this->super_FileFormat).pFieldsTable_);
    OffsetTable::Cleanup((this->super_FileFormat).pOffsetTable_);
  }
  else {
    std::__cxx11::string::reserve((ulong)&local_250);
    std::istream::seekg((long)local_230,_S_beg);
    local_270._M_dataplus._M_p = (pointer)0x0;
    local_270._M_string_length._0_4_ = 0xffffffff;
    std::__cxx11::string::_M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_250,local_250._M_dataplus._M_p,
               local_250._M_dataplus._M_p + local_250._M_string_length,
               *(undefined8 *)((long)auStack_148 + *(long *)(local_230[0] + -0x18)),0xffffffff,in_R9
               ,0,0xffffffff);
    std::ifstream::close();
    JSONWorker::parse((JSONWorker *)&local_278,&local_250);
    paVar2 = &local_270.field_2;
    local_270._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"GlobalMetainfo","");
    if (1 < local_278->refcount) {
      local_278->refcount = local_278->refcount - 1;
      local_278 = internalJSONNode::newInternal(local_278);
    }
    ppJVar4 = internalJSONNode::at(local_278,&local_270);
    GlobalInfoFromJSON(this,*ppJVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    this_00 = (this->super_FileFormat).pFieldsTable_;
    local_270._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"FieldsTable","");
    if (1 < local_278->refcount) {
      local_278->refcount = local_278->refcount - 1;
      local_278 = internalJSONNode::newInternal(local_278);
    }
    ppJVar4 = internalJSONNode::at(local_278,&local_270);
    FieldsTable::TableFromJSON(this_00,*ppJVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    this_01 = (this->super_FileFormat).pOffsetTable_;
    local_270._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"OffsetTable","");
    if (1 < local_278->refcount) {
      local_278->refcount = local_278->refcount - 1;
      local_278 = internalJSONNode::newInternal(local_278);
    }
    ppJVar4 = internalJSONNode::at(local_278,&local_270);
    OffsetTable::TableFromJSON(this_01,*ppJVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    if (local_278 != (internalJSONNode *)0x0) {
      psVar1 = &local_278->refcount;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) {
        internalJSONNode::deleteInternal(local_278);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

void CentralizedFileFormat::ImportTables()
{
    // Open database file and get length
    std::ifstream fs(databaseFile_.c_str());
    std::string json_txt;
    fs.seekg(0, std::ios::end);
    int fileLength = fs.tellg();

    // If file length is 0, then do not interpret JSON and clean the tables
    if (fileLength <= 0)
    {
        fs.close();

        pGlobalMetainfo_->Cleanup();
        pFieldsTable_->Cleanup();
        pOffsetTable_->Cleanup();
        return;
    }

    // Read json
    json_txt.reserve(fileLength);
    fs.seekg(0, std::ios::beg);
    json_txt.assign((std::istreambuf_iterator<char>(fs)), std::istreambuf_iterator<char>());
    fs.close();

    // Interpret JSON
    try
    {
        JSONNode node = libjson::parse(json_txt);

        GlobalInfoFromJSON(node["GlobalMetainfo"]);
        pFieldsTable_->TableFromJSON(node["FieldsTable"]);
        pOffsetTable_->TableFromJSON(node["OffsetTable"]);
    }
    catch(std::exception&)
    {
        std::cerr << "Error: JSON code in file " << databaseFile_ << " is malformed.\n"
                  << "Unable to read data.\n";
        std::exit(1);
    }
}